

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

char * iniparser_getstring(dictionary *d,char *key,char *def)

{
  char *key_00;
  char local_448 [8];
  char tmp_str [1025];
  char *sval;
  char *lc_key;
  char *def_local;
  char *key_local;
  dictionary *d_local;
  
  d_local = (dictionary *)def;
  if ((d != (dictionary *)0x0) && (key != (char *)0x0)) {
    key_00 = strlwc(key,local_448,0x401);
    d_local = (dictionary *)dictionary_get(d,key_00,def);
  }
  return (char *)d_local;
}

Assistant:

const char * iniparser_getstring(const dictionary * d, const char * key, const char * def)
{
    const char * lc_key ;
    const char * sval ;
    char tmp_str[ASCIILINESZ + 1];

    if (d == NULL || key == NULL)
        return def ;

    lc_key = strlwc(key, tmp_str, sizeof(tmp_str));
    sval = dictionary_get(d, lc_key, def);
    return sval ;
}